

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

precise_unit units::commoditizedUnit(string *unit_string,uint64_t match_flags)

{
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>
  *this;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>
  __l;
  precise_unit pVar1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  long lVar5;
  pointer pvVar6;
  precise_unit pVar7;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  *local_438;
  string local_408;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
  local_3e8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
  local_3e0;
  const_iterator tunit;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_3c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_398;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_368;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_338;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_308;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_2d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_2a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_278;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_248;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_218;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_1e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_1b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_188;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_158;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_128;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
  local_f8;
  iterator local_c8;
  size_type local_c0;
  string local_b8;
  undefined1 local_98 [8];
  precise_unit bunit;
  string local_78;
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> cstring;
  int ccindex;
  size_type finish;
  uint64_t match_flags_local;
  string *unit_string_local;
  undefined8 local_10;
  
  lVar5 = std::__cxx11::string::find_last_of((char)unit_string,0x7d);
  if (lVar5 == -1) {
    unit_string_local = (string *)0x7ff4000000000000;
    local_10._0_4_ = (unit_data)0xfa94a488;
    local_10._4_4_ = 0;
    goto LAB_0019f435;
  }
  cstring.field_2._12_4_ = (int)lVar5 + -1;
  segmentcheckReverse(unit_string,'{',(int *)(cstring.field_2._M_local_buf + 0xc));
  std::__cxx11::string::substr((ulong)local_58,(ulong)unit_string);
  if ((int)cstring.field_2._12_4_ < 0) {
    std::__cxx11::string::string((string *)&local_78,(string *)local_58);
    uVar3 = getCommodity(&local_78);
    precise_unit::precise_unit
              ((precise_unit *)&unit_string_local,1.0,(precise_unit *)&precise::one,uVar3);
    std::__cxx11::string::~string((string *)&local_78);
    pVar7.base_units_ = local_10._0_4_;
    pVar7.commodity_ = local_10._4_4_;
    pVar7.multiplier_ = (double)unit_string_local;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_b8,(ulong)unit_string);
    pVar7 = unit_from_string_internal(&local_b8,match_flags + 0x4000000);
    bunit.multiplier_ = pVar7._8_8_;
    local_98 = (undefined1  [8])pVar7.multiplier_;
    std::__cxx11::string::~string((string *)&local_b8);
    bVar2 = is_error((precise_unit *)local_98);
    if (bVar2) {
      pVar7.base_units_ = (unit_data)0xfa94a488;
      pVar7.commodity_ = 0;
      pVar7.multiplier_ = NAN;
    }
    else {
      bVar2 = precise_unit::has_same_base((precise_unit *)local_98,(unit *)&m);
      if (bVar2) {
        if ((commoditizedUnit(std::__cxx11::string_const&,unsigned_long)::commUnits_abi_cxx11_ ==
             '\0') &&
           (iVar4 = __cxa_guard_acquire(&commoditizedUnit(std::__cxx11::string_const&,unsigned_long)
                                         ::commUnits_abi_cxx11_), iVar4 != 0)) {
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
          ::pair<const_char_(&)[8],_true>
                    (&local_3c8,(char (*) [8])"mercury",(precise_unit *)precise::pressure::bases::Hg
                    );
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
          ::pair<const_char_(&)[14],_true>
                    (&local_398,(char (*) [14])"mercurycolumn",
                     (precise_unit *)precise::pressure::bases::Hg);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
          ::pair<const_char_(&)[13],_true>
                    (&local_368,(char (*) [13])"mercuryguage",
                     (precise_unit *)precise::pressure::bases::Hg);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
          ::pair<const_char_(&)[10],_true>
                    (&local_338,(char (*) [10])"mercury_i",
                     (precise_unit *)precise::pressure::bases::Hg);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
          ::pair<const_char_(&)[3],_true>
                    (&local_308,(char (*) [3])0x1ca076,(precise_unit *)precise::pressure::bases::Hg)
          ;
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
          ::pair<const_char_(&)[6],_true>
                    (&local_2d8,(char (*) [6])"water",
                     (precise_unit *)precise::pressure::bases::water);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
          ::pair<const_char_(&)[12],_true>
                    (&local_2a8,(char (*) [12])"watercolumn",
                     (precise_unit *)precise::pressure::bases::water);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
          ::pair<const_char_(&)[8],_true>
                    (&local_278,(char (*) [8])"water_i",
                     (precise_unit *)precise::pressure::bases::water);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
          ::pair<const_char_(&)[11],_true>
                    (&local_248,(char (*) [11])"waterguage",
                     (precise_unit *)precise::pressure::bases::water);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
          ::pair<const_char_(&)[4],_true>
                    (&local_218,(char (*) [4])0x1ca090,
                     (precise_unit *)precise::pressure::bases::water);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
          ::pair<const_char_(&)[13],_true>
                    (&local_1e8,(char (*) [13])"mercury_[00]",
                     (precise_unit *)precise::pressure::bases::Hg_0);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
          ::pair<const_char_(&)[11],_true>
                    (&local_1b8,(char (*) [11])"water_[04]",
                     (precise_unit *)precise::pressure::bases::water_4);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
          ::pair<const_char_(&)[11],_true>
                    (&local_188,(char (*) [11])"water_[39]",
                     (precise_unit *)precise::pressure::bases::water_39);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
          ::pair<const_char_(&)[13],_true>
                    (&local_158,(char (*) [13])"mercury_[32]",
                     (precise_unit *)precise::pressure::bases::Hg_32);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
          ::pair<const_char_(&)[13],_true>
                    (&local_128,(char (*) [13])"mercury_[60]",
                     (precise_unit *)precise::pressure::bases::Hg_60);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
          ::pair<const_char_(&)[11],_true>
                    (&local_f8,(char (*) [11])"water_[60]",
                     (precise_unit *)precise::pressure::bases::water_60);
          local_c8 = &local_3c8;
          local_c0 = 0x10;
          this = (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>
                  *)((long)&tunit.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
                            ._M_cur + 5);
          std::
          allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>
          ::allocator(this);
          __l._M_len = local_c0;
          __l._M_array = local_c8;
          std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
          ::unordered_map(&commoditizedUnit(std::__cxx11::string_const&,unsigned_long)::
                           commUnits_abi_cxx11_,__l,0,
                          (hasher *)
                          ((long)&tunit.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
                                  ._M_cur + 7),
                          (key_equal *)
                          ((long)&tunit.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
                                  ._M_cur + 6),this);
          std::
          allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>
          ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>
                        *)((long)&tunit.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
                                  ._M_cur + 5));
          local_438 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
                       *)&local_c8;
          do {
            local_438 = local_438 + -1;
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>
            ::~pair(local_438);
          } while (local_438 != &local_3c8);
          __cxa_atexit(std::
                       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
                       ::~unordered_map,
                       &commoditizedUnit(std::__cxx11::string_const&,unsigned_long)::
                        commUnits_abi_cxx11_,&__dso_handle);
          __cxa_guard_release(&commoditizedUnit(std::__cxx11::string_const&,unsigned_long)::
                               commUnits_abi_cxx11_);
        }
        local_3e0._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
             ::find(&commoditizedUnit(std::__cxx11::string_const&,unsigned_long)::
                     commUnits_abi_cxx11_,(key_type *)local_58);
        local_3e8._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
             ::end(&commoditizedUnit(std::__cxx11::string_const&,unsigned_long)::
                    commUnits_abi_cxx11_);
        bVar2 = std::__detail::operator!=(&local_3e0,&local_3e8);
        if (bVar2) {
          pvVar6 = std::__detail::
                   _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_false,_true>
                   ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_false,_true>
                                 *)&local_3e0);
          pVar7 = precise_unit::operator*((precise_unit *)local_98,&pvVar6->second);
          goto LAB_0019f41f;
        }
      }
      std::__cxx11::string::string((string *)&local_408,(string *)local_58);
      uVar3 = getCommodity(&local_408);
      precise_unit::precise_unit
                ((precise_unit *)&unit_string_local,1.0,(precise_unit *)local_98,uVar3);
      std::__cxx11::string::~string((string *)&local_408);
      pVar7.base_units_ = local_10._0_4_;
      pVar7.commodity_ = local_10._4_4_;
      pVar7.multiplier_ = (double)unit_string_local;
    }
  }
LAB_0019f41f:
  local_10 = pVar7._8_8_;
  unit_string_local = (string *)pVar7.multiplier_;
  bunit.base_units_ = (unit_data)0x1;
  std::__cxx11::string::~string((string *)local_58);
LAB_0019f435:
  pVar1.base_units_ = local_10._0_4_;
  pVar1.commodity_ = local_10._4_4_;
  pVar1.multiplier_ = (double)unit_string_local;
  return pVar1;
}

Assistant:

static precise_unit
    commoditizedUnit(const std::string& unit_string, std::uint64_t match_flags)
{
    auto finish = unit_string.find_last_of('}');
    if (finish == std::string::npos) {
        // there are checks before this would get called that would catch that
        // error but it is left in place just in case it gets called in an
        // isolated context

        // LCOV_EXCL_START
        return precise::invalid;
        // LCOV_EXCL_STOP
    }
    auto ccindex = static_cast<int>(finish) - 1;
    segmentcheckReverse(unit_string, '{', ccindex);

    auto cstring = unit_string.substr(
        static_cast<size_t>(ccindex) + 2, finish - ccindex - 2);

    if (ccindex < 0) {
        return {1.0, precise::one, getCommodity(cstring)};
    }

    auto bunit = unit_from_string_internal(
        unit_string.substr(0, static_cast<size_t>(ccindex) + 1),
        match_flags + no_commodities);
    if (!is_error(bunit)) {
        if (bunit.has_same_base(m)) {
            static const std::unordered_map<std::string, precise_unit>
                commUnits{
                    {"mercury", precise::pressure::bases::Hg},
                    {"mercurycolumn", precise::pressure::bases::Hg},
                    {"mercuryguage", precise::pressure::bases::Hg},
                    {"mercury_i", precise::pressure::bases::Hg},
                    {"Hg", precise::pressure::bases::Hg},
                    {"water", precise::pressure::bases::water},
                    {"watercolumn", precise::pressure::bases::water},
                    {"water_i", precise::pressure::bases::water},
                    {"waterguage", precise::pressure::bases::water},
                    {"H2O", precise::pressure::bases::water},
                    {"mercury_[00]", precise::pressure::bases::Hg_0},
                    {"water_[04]", precise::pressure::bases::water_4},
                    {"water_[39]", precise::pressure::bases::water_39},
                    {"mercury_[32]", precise::pressure::bases::Hg_32},
                    {"mercury_[60]", precise::pressure::bases::Hg_60},
                    {"water_[60]", precise::pressure::bases::water_60},
                };
            auto tunit = commUnits.find(cstring);
            if (tunit != commUnits.end()) {
                return bunit * tunit->second;
            }
        }
        return {1.0, bunit, getCommodity(cstring)};
    }
    return precise::invalid;
}